

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O0

int __thiscall Scanner::cleanup_tokens(Scanner *this)

{
  Scanner *this_local;
  
  if (this->state == QUOTE_) {
    line_error(this,this->last_qoute_line);
  }
  else if (this->state == ID_) {
    handle_id(this,' ');
  }
  else if (this->state == COLON_) {
    handle_colon(this,' ');
  }
  return 0;
}

Assistant:

int Scanner::cleanup_tokens(void)
{
  if (state == QUOTE_)
  {
    line_error(last_qoute_line);
  }
  else if (state == ID_)
  {
    handle_id(' ');
  }
  else if (state == COLON_)
  {
    handle_colon(' ');
  }
  return 0;
}